

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatCommon.h
# Opt level: O2

void __thiscall llvm::FmtAlign::format(FmtAlign *this,raw_ostream *S,StringRef Options)

{
  uint32_t Count;
  uint32_t Count_00;
  ulong uVar1;
  undefined1 local_a8 [8];
  raw_svector_ostream Stream;
  SmallString<64U> Item;
  
  if (this->Amount != 0) {
    Stream.OS = (SmallVectorImpl<char> *)
                &Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x4000000000;
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)local_a8,(SmallVectorImpl<char> *)&Stream.OS);
    (*this->Adapter->_vptr_format_adapter[3])(this->Adapter,local_a8,Options.Data,Options.Length);
    uVar1 = this->Amount -
            ((ulong)Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                    super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
            0xffffffff);
    if (this->Amount <
        ((ulong)Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
        0xffffffff) || uVar1 == 0) {
      raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
    }
    else {
      Count_00 = (uint32_t)uVar1;
      if (this->Where == Left) {
        raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
        fill(this,S,Count_00);
      }
      else if (this->Where == Center) {
        Count = (uint32_t)(uVar1 >> 1);
        fill(this,S,Count);
        raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
        fill(this,S,Count_00 - Count);
      }
      else {
        fill(this,S,Count_00);
        raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
      }
    }
    raw_ostream::~raw_ostream((raw_ostream *)local_a8);
    SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&Stream.OS);
    return;
  }
  (*this->Adapter->_vptr_format_adapter[3])(this->Adapter,S,Options.Data,Options.Length);
  return;
}

Assistant:

void format(raw_ostream &S, StringRef Options) {
    // If we don't need to align, we can format straight into the underlying
    // stream.  Otherwise we have to go through an intermediate stream first
    // in order to calculate how long the output is so we can align it.
    // TODO: Make the format method return the number of bytes written, that
    // way we can also skip the intermediate stream for left-aligned output.
    if (Amount == 0) {
      Adapter.format(S, Options);
      return;
    }
    SmallString<64> Item;
    raw_svector_ostream Stream(Item);

    Adapter.format(Stream, Options);
    if (Amount <= Item.size()) {
      S << Item;
      return;
    }

    size_t PadAmount = Amount - Item.size();
    switch (Where) {
    case AlignStyle::Left:
      S << Item;
      fill(S, PadAmount);
      break;
    case AlignStyle::Center: {
      size_t X = PadAmount / 2;
      fill(S, X);
      S << Item;
      fill(S, PadAmount - X);
      break;
    }
    default:
      fill(S, PadAmount);
      S << Item;
      break;
    }
  }